

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::initPainter(QWidget *this,QPainter *painter)

{
  undefined8 uVar1;
  QPalette *pQVar2;
  QBrush *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = palette(this);
  foregroundRole(this);
  pQVar3 = (QBrush *)QPalette::brush((ColorGroup)pQVar2,Dark);
  QPen::QPen((QPen *)&local_38,pQVar3,1.0,SolidLine,SquareCap,BevelJoin);
  uVar1 = *(undefined8 *)(*(long *)(*(long *)painter + 0x40) + 0x40);
  *(undefined1 **)(*(long *)(*(long *)painter + 0x40) + 0x40) = local_38;
  local_38 = (undefined1 *)uVar1;
  QPen::~QPen((QPen *)&local_38);
  backgroundRole(this);
  pQVar3 = (QBrush *)QPalette::brush((ColorGroup)pQVar2,Dark);
  QBrush::operator=((QBrush *)(*(long *)(*(long *)painter + 0x40) + 0x50),pQVar3);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_38,&this->data->fnt,&this->super_QPaintDevice);
  QFont::operator=((QFont *)(*(long *)(*(long *)painter + 0x40) + 0x30),(QFont *)&local_38);
  QFont::operator=((QFont *)(*(long *)(*(long *)painter + 0x40) + 0x20),(QFont *)&local_38);
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::initPainter(QPainter *painter) const
{
    const QPalette &pal = palette();
    painter->d_func()->state->pen = QPen(pal.brush(foregroundRole()), 1);
    painter->d_func()->state->bgBrush = pal.brush(backgroundRole());
    QFont f(font(), const_cast<QWidget *>(this));
    painter->d_func()->state->deviceFont = f;
    painter->d_func()->state->font = f;
}